

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-equip-cmp.c
# Opt level: O3

void apply_complex_filter(equippable_filter *f,equippable_summary *s)

{
  equippable_expr *peVar1;
  char cVar2;
  wchar_t wVar3;
  char *p;
  long lVar4;
  long lVar5;
  wchar_t wVar6;
  ulong uVar7;
  long lVar8;
  
  if ((long)f->nv < 1) {
    __assert_fail("f->nv > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                  ,0x6eb,
                  "void apply_complex_filter(const struct equippable_filter *, struct equippable_summary *)"
                 );
  }
  p = (char *)mem_alloc((long)f->nv);
  s->nfilt = L'\0';
  uVar7 = 0;
  if (L'\0' < s->nitems) {
    lVar4 = 0;
LAB_001e6b5d:
    wVar3 = f->nv;
    if (wVar3 < L'\0') {
LAB_001e6cc3:
      __assert_fail("j <= f->nv",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                    ,0x6f3,
                    "void apply_complex_filter(const struct equippable_filter *, struct equippable_summary *)"
                   );
    }
    lVar8 = -1;
    lVar5 = 8;
    do {
      peVar1 = f->v;
      wVar6 = (wchar_t)uVar7;
      switch(*(undefined4 *)((long)&(peVar1->s).ex + lVar5)) {
      case 0:
        if (wVar3 <= wVar6) {
          __assert_fail("nst < f->nv",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                        ,0x702,
                        "void apply_complex_filter(const struct equippable_filter *, struct equippable_summary *)"
                       );
        }
        cVar2 = (**(code **)((long)peVar1 + lVar5 + -8))
                          (s->items + lVar4,(long)&(peVar1->s).func + lVar5);
        p[wVar6] = cVar2;
        uVar7 = (ulong)(uint)(wVar6 + L'\x01');
        wVar3 = f->nv;
        break;
      case 1:
        if (wVar6 < L'\x02') {
          __assert_fail("nst >= 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                        ,0x709,
                        "void apply_complex_filter(const struct equippable_filter *, struct equippable_summary *)"
                       );
        }
        if (p[uVar7 - 1] == '\x01') {
          cVar2 = p[uVar7 - 2];
        }
        else {
          cVar2 = '\0';
        }
        p[uVar7 - 2] = cVar2;
        goto LAB_001e6c12;
      case 2:
        if (wVar6 < L'\x02') {
          __assert_fail("nst >= 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                        ,0x710,
                        "void apply_complex_filter(const struct equippable_filter *, struct equippable_summary *)"
                       );
        }
        cVar2 = '\x01';
        if (p[uVar7 - 1] == '\0') {
          cVar2 = p[uVar7 - 2];
        }
        p[uVar7 - 2] = cVar2;
LAB_001e6c12:
        uVar7 = (ulong)(uint)(wVar6 + L'\xffffffff');
        break;
      case 3:
        goto switchD_001e6b9b_caseD_3;
      }
      lVar8 = lVar8 + 1;
      lVar5 = lVar5 + 0x18;
      if (wVar3 <= lVar8) goto LAB_001e6cc3;
    } while( true );
  }
LAB_001e6ca1:
  s->sorted_indices[uVar7] = -1;
  mem_free(p);
  return;
switchD_001e6b9b_caseD_3:
  if (wVar6 != L'\x01') {
    __assert_fail("nst == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                  ,0x6f6,
                  "void apply_complex_filter(const struct equippable_filter *, struct equippable_summary *)"
                 );
  }
  wVar3 = s->nitems;
  if (*p == '\x01') {
    wVar6 = s->nfilt;
    if ((wVar3 <= wVar6) || (s->nalloc <= wVar6)) {
      __assert_fail("s->nfilt < s->nitems && s->nfilt < s->nalloc",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                    ,0x6f9,
                    "void apply_complex_filter(const struct equippable_filter *, struct equippable_summary *)"
                   );
    }
    s->sorted_indices[wVar6] = (int)lVar4;
    s->nfilt = s->nfilt + L'\x01';
    wVar3 = s->nitems;
  }
  lVar4 = lVar4 + 1;
  uVar7 = 1;
  if (wVar3 <= lVar4) goto code_r0x001e6c99;
  goto LAB_001e6b5d;
code_r0x001e6c99:
  uVar7 = (ulong)s->nfilt;
  goto LAB_001e6ca1;
}

Assistant:

static void apply_complex_filter(const struct equippable_filter *f,
	struct equippable_summary *s)
{
	bool *stack;
	int nst, i;

	assert(f->nv > 0);
	stack = mem_alloc(f->nv * sizeof(*stack));
	nst = 0;
	s->nfilt = 0;
	for (i = 0; i < s->nitems; ++i) {
		int j = 0;

		while (1) {
			assert(j <= f->nv);

			if (f->v[j].c == EQUIP_EXPR_TERMINATOR) {
				assert(nst == 1);
				if (stack[0]) {
					assert(s->nfilt < s->nitems &&
						s->nfilt < s->nalloc);
					s->sorted_indices[s->nfilt] = i;
					++s->nfilt;
				}
				break;
			}

			switch (f->v[j].c) {
			case EQUIP_EXPR_SELECTOR:
				assert(nst < f->nv);
				stack[nst] = (*f->v[j].s.func)(s->items + i,
					&f->v[j].s.ex);
				++nst;
				break;

			case EQUIP_EXPR_AND:
				assert(nst >= 2);
				stack[nst - 2] =
					(stack[nst - 1] && stack[nst - 2]);
				--nst;
				break;

			case EQUIP_EXPR_OR:
				assert(nst >= 2);
				stack[nst - 2] =
					(stack[nst - 1] || stack[nst - 2]);
				--nst;
				break;

			case EQUIP_EXPR_TERMINATOR:
				assert(0);
			}
			++j;
		}
	}

	s->sorted_indices[s->nfilt] = -1;

	mem_free(stack);
}